

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_ref.cpp
# Opt level: O3

ON_SubDComponentRef * __thiscall
ON_SubDComponentRefList::AppendForExperts
          (ON_SubDComponentRefList *this,ON_SubD *subd,ON_COMPONENT_INDEX ci,
          ON_SubDComponentLocation component_location,ON__UINT_PTR reference_id)

{
  bool bVar1;
  ON_SubDComponentRef *pOVar2;
  ON_SubDRef subd_ref;
  ON_SubDRef local_40;
  
  bVar1 = ON_SubD::IsEmpty(subd);
  if (bVar1) {
    pOVar2 = &ON_SubDComponentRef::Empty;
  }
  else {
    ON_SubDRef::ON_SubDRef(&local_40,subd);
    pOVar2 = Append(this,&local_40,ci,component_location,reference_id);
    ON_SubDRef::~ON_SubDRef(&local_40);
  }
  return pOVar2;
}

Assistant:

const ON_SubDComponentRef& ON_SubDComponentRefList::AppendForExperts(
  const ON_SubD& subd,
  ON_COMPONENT_INDEX ci,
  ON_SubDComponentLocation component_location,
  ON__UINT_PTR reference_id
)
{
  for (;;)
  {
    if (subd.IsEmpty())
      break;
    return Append(ON_SubDRef::CreateReferenceForExperts(subd),ci,component_location,reference_id);
  }
  return ON_SubDComponentRef::Empty;
}